

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O3

void __thiscall testing::TestCase::~TestCase(TestCase *this)

{
  pointer ppTVar1;
  TestInfo *this_00;
  pointer piVar2;
  pointer pcVar3;
  pointer ppTVar4;
  
  this->_vptr_TestCase = (_func_int **)&PTR__TestCase_00160588;
  ppTVar1 = (this->test_info_list_).
            super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppTVar4 = (this->test_info_list_).
                 super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppTVar4 != ppTVar1; ppTVar4 = ppTVar4 + 1
      ) {
    this_00 = *ppTVar4;
    if (this_00 != (TestInfo *)0x0) {
      TestInfo::~TestInfo(this_00);
    }
    operator_delete(this_00);
  }
  std::vector<testing::TestProperty,_std::allocator<testing::TestProperty>_>::~vector
            (&(this->ad_hoc_test_result_).test_properties_);
  std::vector<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>::~vector
            (&(this->ad_hoc_test_result_).test_part_results_);
  internal::Mutex::~Mutex(&(this->ad_hoc_test_result_).test_properites_mutex_);
  piVar2 = (this->test_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar2 != (pointer)0x0) {
    operator_delete(piVar2);
  }
  ppTVar4 = (this->test_info_list_).
            super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppTVar4 != (pointer)0x0) {
    operator_delete(ppTVar4);
  }
  internal::
  scoped_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::reset(&this->type_param_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pcVar3 = (this->name_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != &(this->name_).field_2) {
    operator_delete(pcVar3);
    return;
  }
  return;
}

Assistant:

TestCase::~TestCase() {
  // Deletes every Test in the collection.
  ForEach(test_info_list_, internal::Delete<TestInfo>);
}